

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cliques.cpp
# Opt level: O0

void bron_kerbosch(set<int,_std::less<int>,_std::allocator<int>_> *R,
                  set<int,_std::less<int>,_std::allocator<int>_> *P,
                  set<int,_std::less<int>,_std::allocator<int>_> *X)

{
  size_t *psVar1;
  bool bVar2;
  reference piVar3;
  reference pvVar4;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar5;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> iVar6;
  set<int,_std::less<int>,_std::allocator<int>_> local_250;
  set<int,_std::less<int>,_std::allocator<int>_> local_220;
  set<int,_std::less<int>,_std::allocator<int>_> local_1f0;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> local_1c0;
  _Base_ptr local_1b0;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> local_1a8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_198;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_190;
  _Rb_tree_const_iterator<int> local_188;
  _Rb_tree_const_iterator<int> local_180;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> local_178;
  _Base_ptr local_168;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> local_160;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_150;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_148;
  _Rb_tree_const_iterator<int> local_140;
  _Rb_tree_const_iterator<int> local_138;
  _Base_ptr local_130;
  undefined1 local_128;
  undefined1 local_110 [8];
  set<int,_std::less<int>,_std::allocator<int>_> newX;
  set<int,_std::less<int>,_std::allocator<int>_> newP;
  set<int,_std::less<int>,_std::allocator<int>_> newR;
  iterator iStack_78;
  int i;
  iterator __end2;
  iterator __begin2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  set<int,_std::less<int>,_std::allocator<int>_> foriterate;
  _Rb_tree_const_iterator<int> local_28;
  set<int,_std::less<int>,_std::allocator<int>_> *local_20;
  set<int,_std::less<int>,_std::allocator<int>_> *X_local;
  set<int,_std::less<int>,_std::allocator<int>_> *P_local;
  set<int,_std::less<int>,_std::allocator<int>_> *R_local;
  
  local_20 = X;
  X_local = P;
  P_local = R;
  bVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty(P);
  if ((bVar2) && (bVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty(X), bVar2)) {
    local_28._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(R);
    foriterate._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::set<int,_std::less<int>,_std::allocator<int>_>::end(R);
    std::
    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
    ::emplace_back<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>>
              ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)(anonymous_namespace)::cliques,&local_28,
               (_Rb_tree_const_iterator<int> *)
               &foriterate._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  else {
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range2,P);
    __end2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range2);
    iStack_78 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range2);
    while( true ) {
      bVar2 = std::operator!=(&__end2,&stack0xffffffffffffff88);
      if (!bVar2) break;
      piVar3 = std::_Rb_tree_const_iterator<int>::operator*(&__end2);
      newR._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = *piVar3;
      psVar1 = &newP._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::set<int,_std::less<int>,_std::allocator<int>_>::set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)psVar1);
      std::set<int,_std::less<int>,_std::allocator<int>_>::set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)
                 &newX._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::set<int,_std::less<int>,_std::allocator<int>_>::set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)local_110);
      std::set<int,_std::less<int>,_std::allocator<int>_>::operator=
                ((set<int,_std::less<int>,_std::allocator<int>_> *)psVar1,R);
      pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)
                         &newP._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (value_type_conflict *)
                         ((long)&newR._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
      local_130 = (_Base_ptr)pVar5.first._M_node;
      local_128 = pVar5.second;
      local_138._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(P);
      local_140._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(P);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&edge,(long)newR._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_)
      ;
      local_148._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(pvVar4);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&edge,(long)newR._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_)
      ;
      local_150._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(pvVar4);
      psVar1 = &newX._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_168 = (_Base_ptr)
                  std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)psVar1);
      iVar6 = std::inserter<std::set<int,std::less<int>,std::allocator<int>>>
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)psVar1,
                         (iterator)local_168);
      local_160 = iVar6;
      iVar6 = std::
              set_intersection<std::_Rb_tree_const_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>>
                        (local_138,local_140,local_148,local_150,iVar6);
      local_178 = iVar6;
      local_180._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(X);
      local_188._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(X);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&edge,(long)newR._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_)
      ;
      local_190._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(pvVar4);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&edge,(long)newR._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_)
      ;
      local_198._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(pvVar4);
      local_1b0 = (_Base_ptr)
                  std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_110);
      iVar6 = std::inserter<std::set<int,std::less<int>,std::allocator<int>>>
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)local_110,
                         (iterator)local_1b0);
      local_1a8 = iVar6;
      iVar6 = std::
              set_intersection<std::_Rb_tree_const_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>>
                        (local_180,local_188,local_190,local_198,iVar6);
      local_1c0 = iVar6;
      std::set<int,_std::less<int>,_std::allocator<int>_>::set
                (&local_1f0,
                 (set<int,_std::less<int>,_std::allocator<int>_> *)
                 &newP._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::set<int,_std::less<int>,_std::allocator<int>_>::set
                (&local_220,
                 (set<int,_std::less<int>,_std::allocator<int>_> *)
                 &newX._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::set<int,_std::less<int>,_std::allocator<int>_>::set
                (&local_250,(set<int,_std::less<int>,_std::allocator<int>_> *)local_110);
      bron_kerbosch(&local_1f0,&local_220,&local_250);
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_250);
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_220);
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_1f0);
      std::set<int,_std::less<int>,_std::allocator<int>_>::erase
                (P,(key_type *)((long)&newR._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                (X,(value_type_conflict *)
                   ((long)&newR._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)local_110);
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)
                 &newX._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)
                 &newP._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::_Rb_tree_const_iterator<int>::operator++(&__end2);
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range2);
  }
  return;
}

Assistant:

void bron_kerbosch(set <int> R, set <int> P, set <int> X) { // where R is probable clique, P - possible vertices in clique, X - exluded vertices
    if (P.empty() && X.empty()) { // R is maximal clique
        cliques.emplace_back(R.begin(), R.end());
    }
    else {
        set <int> foriterate = P;
        for (auto i : foriterate) {
            set <int> newR;
            set <int> newP;
            set <int> newX;

            newR = R;
            newR.insert(i);

            set_intersection(P.begin(), P.end(), edge[i].begin(), edge[i].end(), inserter(newP, newP.begin()));

            set_intersection(X.begin(), X.end(), edge[i].begin(), edge[i].end(), inserter(newX, newX.begin()));

            bron_kerbosch(newR, newP, newX);

            P.erase(i);
            X.insert(i);
        }
    }
}